

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
rtb::Filter::Filter<double>::pass
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Filter<double> *this,
          vector<double,_std::allocator<double>_> *values)

{
  bool bVar1;
  reference pdVar2;
  double local_50;
  double local_48;
  double val;
  const_iterator __end0;
  const_iterator __begin0;
  vector<double,_std::allocator<double>_> *__range2;
  vector<double,_std::allocator<double>_> *values_local;
  Filter<double> *this_local;
  vector<double,_std::allocator<double>_> *filteredValues;
  
  resetState(this);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  __end0 = std::vector<double,_std::allocator<double>_>::begin(values);
  val = (double)std::vector<double,_std::allocator<double>_>::end(values);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                     *)&val), bVar1) {
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end0);
    local_48 = *pdVar2;
    local_50 = filter(this,local_48);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_50);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> Filter<T>::pass(const std::vector<T>& values) {
            resetState();
            std::vector<T> filteredValues;
            for (auto val : values)
                filteredValues.push_back(filter(val));
            return filteredValues;
        }